

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

uint32_t __thiscall jbcoin::STObject::getFlags(STObject *this)

{
  STBase *pSVar1;
  STInteger<unsigned_int> *local_30;
  STUInt32 *t;
  STObject *this_local;
  
  pSVar1 = peekAtPField(this,(SField *)sfFlags);
  if (pSVar1 == (STBase *)0x0) {
    local_30 = (STInteger<unsigned_int> *)0x0;
  }
  else {
    local_30 = (STInteger<unsigned_int> *)
               __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
  }
  if (local_30 == (STInteger<unsigned_int> *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = STInteger<unsigned_int>::value(local_30);
  }
  return this_local._4_4_;
}

Assistant:

std::uint32_t STObject::getFlags (void) const
{
    const STUInt32* t = dynamic_cast<const STUInt32*> (peekAtPField (sfFlags));

    if (!t)
        return 0;

    return t->value ();
}